

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  uint32_t *out;
  size_t sVar1;
  uchar *puVar2;
  libssh2_nonblocking_states lVar3;
  int iVar4;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar5;
  LIBSSH2_SFTP *sftp;
  ssize_t sVar6;
  size_t sVar7;
  char *pcVar8;
  uchar *puVar9;
  uchar *data;
  time_t local_90;
  size_t data_len;
  uchar *local_80;
  string_buf buf;
  size_t local_50;
  size_t name_len;
  uchar *extdata;
  uchar *extname;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 8) != 0) {
      start_time = time((time_t *)0x0);
      local_80 = session->sftpInit_buffer;
LAB_0012251e:
      data_len = 0;
      lVar3 = session->sftpInit_state;
      sftp = session->sftpInit_sftp;
      switch(lVar3) {
      case libssh2_NB_state_idle:
        goto switchD_00122549_caseD_0;
      default:
        goto switchD_00122549_caseD_1;
      case libssh2_NB_state_created:
        goto switchD_00122549_caseD_2;
      case libssh2_NB_state_sent:
        pLVar5 = session->sftpInit_channel;
        goto LAB_001225a9;
      case libssh2_NB_state_sent1:
        goto switchD_00122549_caseD_4;
      case libssh2_NB_state_sent2:
        sVar7 = session->sftpInit_sent;
        puVar9 = local_80;
        goto LAB_0012268b;
      }
    }
    _libssh2_error(session,-0x22,"session not authenticated yet");
  }
  return (LIBSSH2_SFTP *)0x0;
switchD_00122549_caseD_0:
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    __assert_fail("!session->sftpInit_sftp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/sftp.c"
                  ,0x34d,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
  }
  session->sftpInit_state = libssh2_NB_state_created;
switchD_00122549_caseD_2:
  pLVar5 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->sftpInit_channel = pLVar5;
  if (pLVar5 == (LIBSSH2_CHANNEL *)0x0) {
    iVar4 = libssh2_session_last_errno(session);
    if (iVar4 == -0x25) {
      pcVar8 = "Would block starting up channel";
      goto LAB_001227ae;
    }
    _libssh2_error(session,-0x15,"Unable to startup channel");
LAB_001227da:
    session->sftpInit_state = libssh2_NB_state_idle;
LAB_0012287a:
    sftp = (LIBSSH2_SFTP *)0x0;
  }
  else {
    session->sftpInit_state = libssh2_NB_state_sent;
LAB_001225a9:
    iVar4 = _libssh2_channel_process_startup(pLVar5,"subsystem",9,"sftp",4);
    if (iVar4 != 0) {
      if (iVar4 != -0x25) {
        iVar4 = -0x15;
        pcVar8 = "Unable to request SFTP subsystem";
        goto LAB_0012286b;
      }
      pcVar8 = "Would block to request SFTP subsystem";
LAB_001227ae:
      _libssh2_error(session,-0x25,pcVar8);
      goto LAB_0012287a;
    }
    session->sftpInit_state = libssh2_NB_state_sent1;
switchD_00122549_caseD_4:
    iVar4 = _libssh2_channel_extended_data(session->sftpInit_channel,1);
    if (iVar4 == -0x25) {
      pcVar8 = "Would block requesting handle extended data";
      goto LAB_001227ae;
    }
    sftp = (LIBSSH2_SFTP *)_libssh2_calloc(session,0x170);
    puVar9 = local_80;
    session->sftpInit_sftp = sftp;
    if (sftp == (LIBSSH2_SFTP *)0x0) {
      iVar4 = -6;
      pcVar8 = "Unable to allocate a new SFTP structure";
      goto LAB_0012286b;
    }
    sftp->channel = session->sftpInit_channel;
    sftp->request_id = 0;
    _libssh2_htonu32(local_80,5);
    session->sftpInit_buffer[4] = '\x01';
    _libssh2_htonu32(session->sftpInit_buffer + 5,3);
    session->sftpInit_sent = 0;
    session->sftpInit_state = libssh2_NB_state_sent2;
    sVar7 = 0;
LAB_0012268b:
    sVar6 = _libssh2_channel_write(session->sftpInit_channel,0,puVar9 + sVar7,9 - sVar7);
    if (sVar6 == -0x25) {
      pcVar8 = "Would block sending SSH_FXP_INIT";
      goto LAB_001227ae;
    }
    if (sVar6 < 0) {
      iVar4 = -7;
      pcVar8 = "Unable to send SSH_FXP_INIT";
LAB_0012286b:
      _libssh2_error(session,iVar4,pcVar8);
LAB_00122870:
      session->sftpInit_state = libssh2_NB_state_error_closing;
      goto LAB_0012287a;
    }
    sVar7 = sVar6 + session->sftpInit_sent;
    session->sftpInit_sent = sVar7;
    if (sVar7 == 9) {
      session->sftpInit_state = libssh2_NB_state_sent3;
    }
    else {
      lVar3 = session->sftpInit_state;
switchD_00122549_caseD_1:
      if (lVar3 == libssh2_NB_state_error_closing) {
        iVar4 = _libssh2_channel_free(session->sftpInit_channel);
        if (iVar4 != -0x25) {
          session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
          if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
            (*session->free)(session->sftpInit_sftp,&session->abstract);
            session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
          }
          goto LAB_001227da;
        }
        pcVar8 = "Would block closing channel";
        goto LAB_001227ae;
      }
    }
    iVar4 = sftp_packet_require(sftp,'\x02',0,&data,&data_len,5);
    sVar7 = data_len;
    puVar9 = data;
    if (iVar4 == -0x26) {
      if (data_len != 0) {
        (*session->free)(data,&session->abstract);
      }
      iVar4 = -0x1f;
      pcVar8 = "Invalid SSH_FXP_VERSION response";
      goto LAB_0012286b;
    }
    if (iVar4 != 0) {
      if (iVar4 == -0x25) {
        pcVar8 = "Would block receiving SSH_FXP_VERSION";
        goto LAB_001227ae;
      }
      pcVar8 = "Timeout waiting for response from SFTP subsystem";
      goto LAB_0012286b;
    }
    buf.data = data;
    buf.dataptr = data + 1;
    buf.len = data_len;
    out = &sftp->version;
    local_90 = start_time;
    iVar4 = _libssh2_get_u32(&buf,out);
    if (iVar4 != 0) {
      (*session->free)(data,&session->abstract);
      start_time = local_90;
      goto LAB_00122870;
    }
    if (3 < *out) {
      *out = 3;
    }
    while (buf.dataptr < puVar9 + sVar7) {
      iVar4 = _libssh2_get_string(&buf,&extname,&name_len);
      if (iVar4 != 0) {
        (*session->free)(data,&session->abstract);
        pcVar8 = "Data too short when extracting extname";
LAB_001229c6:
        _libssh2_error(session,-0x26,pcVar8);
        start_time = local_90;
        goto LAB_00122870;
      }
      iVar4 = _libssh2_get_string(&buf,&extdata,&local_50);
      puVar2 = extdata;
      sVar1 = local_50;
      if (iVar4 != 0) {
        (*session->free)(data,&session->abstract);
        pcVar8 = "Data too short when extracting extdata";
        goto LAB_001229c6;
      }
      if ((((name_len == 0x18) &&
           (iVar4 = bcmp(extname,"posix-rename@openssh.com",0x18), sVar1 == 1)) && (iVar4 == 0)) &&
         (*puVar2 == '1')) {
        sftp->posix_rename_extension = 1;
      }
    }
    (*session->free)(data,&session->abstract);
    pLVar5 = sftp->channel;
    pLVar5->abstract = sftp;
    pLVar5->close_cb = libssh2_sftp_dtor;
    session->sftpInit_state = libssh2_NB_state_idle;
    session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
    session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
    _libssh2_list_init(&sftp->sftp_handles);
    start_time = local_90;
  }
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    return sftp;
  }
  if (session->api_block_mode == 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = libssh2_session_last_errno(session);
  if (iVar4 != -0x25) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = _libssh2_wait_socket(session,start_time);
  if (iVar4 != 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  goto LAB_0012251e;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}